

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystem.cpp
# Opt level: O1

void __thiscall
solitaire::graphics::SDLGraphicsSystem::throwOnInvalidTextureOperation
          (SDLGraphicsSystem *this,TextureId *id)

{
  runtime_error *this_00;
  ulong uVar1;
  
  if (this->isWindowCreated == false) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Cannot operate on textures when window not created");
  }
  else {
    uVar1 = ((long)(this->textures).
                   super__Vector_base<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>,_std::allocator<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->textures).
                   super__Vector_base<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>,_std::allocator<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    if (id->t <= uVar1 && uVar1 - id->t != 0) {
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unknown texture id: " + id->t);
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SDLGraphicsSystem::throwOnInvalidTextureOperation(const TextureId id) const {
    if (not isWindowCreated)
        throw std::runtime_error {"Cannot operate on textures when window not created"};

    if (id.t >= textures.size())
        throw std::runtime_error {"Unknown texture id: " + id};
}